

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::writeSequentialContainer<QList<QList<QString>>>(QDataStream *s,QList<QList<QString>_> *c)

{
  bool bVar1;
  const_iterator o;
  QList<QList<QString>_> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  value_type *t;
  QList<QList<QString>_> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  QDataStream *in_stack_ffffffffffffffa8;
  QDataStream *s_00;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s_00 = in_RDI;
  QList<QList<QString>_>::size(in_RSI);
  bVar1 = QDataStream::writeQSizeType(in_stack_ffffffffffffffa8,0xb12561);
  if (bVar1) {
    local_10.i = (QList<QString> *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QList<QString>_>::begin((QList<QList<QString>_> *)s_00);
    o = QList<QList<QString>_>::end((QList<QList<QString>_> *)s_00);
    while (bVar1 = QList<QList<QString>_>::const_iterator::operator!=(&local_10,o), bVar1) {
      QList<QList<QString>_>::const_iterator::operator*(&local_10);
      ::operator<<(s_00,(QList<QString> *)in_stack_ffffffffffffffa8);
      QList<QList<QString>_>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}